

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O0

bool __thiscall axl::cry::X509Cert::create(X509Cert *this)

{
  bool bVar1;
  X509 *pXVar2;
  int in_ESI;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *in_RDI;
  
  sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::close(in_RDI,in_ESI);
  pXVar2 = X509_new();
  in_RDI->m_h = (x509_st *)pXVar2;
  bVar1 = completeWithLastCryptoError(0);
  return bVar1;
}

Assistant:

bool
X509Cert::create() {
	close();

	m_h = X509_new();
	return completeWithLastCryptoError(m_h != NULL);
}